

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
          (View<int,_true,_std::allocator<unsigned_long>_> *this,int n)

{
  size_type __n;
  pointer piVar1;
  ulong uVar2;
  int n_00;
  runtime_error *prVar3;
  int iVar4;
  ulong uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  allocator_type local_29;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Assertion failed.");
  }
  else {
    __n = (this->geometry_).dimension_;
    if (__n != 0) {
      iVar4 = (int)__n;
      n_00 = n - iVar4;
      if (-iVar4 < n && n < iVar4) {
        if (n < 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_28,__n,&local_29);
          piVar1 = this->data_;
          if (piVar1 != (pointer)0x0) {
            uVar5 = 0;
            do {
              uVar2 = (this->geometry_).dimension_;
              if (uVar2 <= uVar5) {
                View<int,true,std::allocator<unsigned_long>>::
                permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          ((View<int,true,std::allocator<unsigned_long>> *)this,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_28.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start);
                if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
                  operator_delete(local_28.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_28.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_28.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_0022bb7b;
              }
              local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5] = (ulong)(long)((int)uVar5 - n) % uVar2;
              uVar5 = uVar5 + 1;
            } while (piVar1 != (pointer)0x0);
          }
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Assertion failed.");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        n_00 = n % iVar4;
      }
      shift(this,n_00);
LAB_0022bb7b:
      testInvariant(this);
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Assertion failed.");
  }
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::shift
(
    const int n
) 
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || dimension() != 0);
    if(n <= -static_cast<int>(dimension()) || n >= static_cast<int>(dimension())) {
        shift(n % static_cast<int>(dimension()));
    }
    else {
        if(n > 0) {
            shift(n - static_cast<int>(dimension()));
        }
        else {
            std::vector<std::size_t> p(dimension());
            for(std::size_t j=0; j<dimension(); ++j) {
                p[j] = static_cast<std::size_t>((static_cast<int>(j) - n)) % dimension();
            }
            permute(p.begin());
        }
    }
    testInvariant();
}